

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.h
# Opt level: O0

int bandit::run(int argc,char **argv,choice_options *choices,bool allow_further)

{
  bool bVar1;
  bool dry_run;
  bandit *this;
  filter_chain_t *__x;
  spec_registry *specs;
  controller_t *controller_00;
  vector<bandit::run_policy::filter_chain_element,_std::allocator<bandit::run_policy::filter_chain_element>_>
  local_180;
  undefined1 local_168 [8];
  controller_t controller;
  undefined1 local_e0 [8];
  options opt;
  bool allow_further_local;
  choice_options *choices_local;
  char **argv_local;
  int argc_local;
  
  opt._183_1_ = allow_further;
  detail::options::options((options *)local_e0,argc,argv,choices);
  if (((opt._183_1_ & 1) == 0) &&
     ((bVar1 = detail::options::has_further_arguments((options *)local_e0), bVar1 ||
      (bVar1 = detail::options::has_unknown_options((options *)local_e0), bVar1)))) {
    detail::options::print_usage((options *)local_e0);
    argv_local._4_4_ = 1;
    controller.run_policy._M_t.
    super___uniq_ptr_impl<bandit::run_policy::interface,_std::default_delete<bandit::run_policy::interface>_>
    ._M_t.
    super__Tuple_impl<0UL,_bandit::run_policy::interface_*,_std::default_delete<bandit::run_policy::interface>_>
    .super__Head_base<0UL,_bandit::run_policy::interface_*,_false>._M_head_impl._0_4_ = 1;
  }
  else {
    detail::controller_t::controller_t((controller_t *)local_168);
    bVar1 = detail::options::update_controller_settings
                      ((options *)local_e0,(controller_t *)local_168);
    if (bVar1) {
      this = (bandit *)operator_new(0x30);
      __x = detail::options::filter_chain((options *)local_e0);
      std::
      vector<bandit::run_policy::filter_chain_element,_std::allocator<bandit::run_policy::filter_chain_element>_>
      ::vector(&local_180,__x);
      bVar1 = detail::options::break_on_failure((options *)local_e0);
      dry_run = detail::options::dry_run((options *)local_e0);
      run_policy::bandit::bandit(this,&local_180,bVar1,dry_run);
      detail::controller_t::set_policy((controller_t *)local_168,(run_policy_t *)this);
      std::
      vector<bandit::run_policy::filter_chain_element,_std::allocator<bandit::run_policy::filter_chain_element>_>
      ::~vector(&local_180);
      detail::register_controller((controller_t *)local_168);
      specs = detail::specs_abi_cxx11_();
      controller_00 = detail::registered_controller();
      argv_local._4_4_ = run((options *)local_e0,specs,controller_00);
    }
    else {
      argv_local._4_4_ = 1;
    }
    controller.run_policy._M_t.
    super___uniq_ptr_impl<bandit::run_policy::interface,_std::default_delete<bandit::run_policy::interface>_>
    ._M_t.
    super__Tuple_impl<0UL,_bandit::run_policy::interface_*,_std::default_delete<bandit::run_policy::interface>_>
    .super__Head_base<0UL,_bandit::run_policy::interface_*,_false>._M_head_impl._0_4_ = 1;
    detail::controller_t::~controller_t((controller_t *)local_168);
  }
  detail::options::~options((options *)local_e0);
  return argv_local._4_4_;
}

Assistant:

inline int run(int argc, char* argv[], const detail::choice_options& choices, bool allow_further = true) {
    detail::options opt(argc, argv, choices);

    if (!allow_further &&
        (opt.has_further_arguments() || opt.has_unknown_options())) {
      opt.print_usage();
      return 1;
    }

    detail::controller_t controller;
    if (!opt.update_controller_settings(controller)) {
      return 1;
    }

    controller.set_policy(new run_policy::bandit(opt.filter_chain(), opt.break_on_failure(), opt.dry_run()));

    detail::register_controller(&controller);
    return run(opt, detail::specs());
  }